

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool llvm::sys::path::has_stem(Twine *path,Style style)

{
  Style in_ECX;
  StringRef SVar1;
  StringRef path_00;
  SmallString<128U> path_storage;
  SmallVectorImpl<char> local_a8;
  undefined1 local_98 [128];
  
  local_a8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_a8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_a8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_98;
  SVar1 = Twine::toStringRef(path,&local_a8);
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)SVar1.Length;
  path_00.Length._4_4_ = 0;
  SVar1 = stem((path *)SVar1.Data,path_00,in_ECX);
  if ((undefined1 *)
      local_a8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_98) {
    free(local_a8.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return SVar1.Length != 0;
}

Assistant:

bool has_stem(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !stem(p, style).empty();
}